

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O1

LispPTR CHAR_openfile(LispPTR *args)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar7;
  DLword *pDVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char pathname [4096];
  char local_1038 [4104];
  long lVar6;
  
  pcVar9 = local_1038;
  uVar4 = args[2];
  if ((uVar4 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
  }
  Lisp_errno = (int *)(Lisp_world + uVar4);
  uVar4 = *args;
  if ((uVar4 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
  }
  iVar3 = *(int *)(Lisp_world + (ulong)uVar4 + 4);
  iVar2 = 0x1000;
  if (iVar3 < 0x1000) {
    iVar2 = iVar3;
  }
  lVar6 = (long)iVar2;
  if ((char)Lisp_world[(ulong)uVar4 + 3] == 'D') {
    pcVar10 = local_1038;
    if (iVar3 != 0) {
      lVar6 = lVar6 + (ulong)(lVar6 == 0);
      pDVar8 = Lisp_world +
               (ulong)Lisp_world[(ulong)uVar4 + 2] +
               (ulong)(*(uint *)(Lisp_world + uVar4) & 0xfffffff);
      do {
        *pcVar9 = *(undefined1 *)((ulong)pDVar8 ^ 2);
        pcVar9 = pcVar9 + 1;
        pDVar8 = pDVar8 + 1;
        lVar6 = lVar6 + -1;
        pcVar10 = pcVar9;
      } while (lVar6 != 0);
    }
    *pcVar10 = 0;
  }
  else if ((char)Lisp_world[(ulong)uVar4 + 3] == 'C') {
    if (iVar3 != 0) {
      uVar5 = *(uint *)(Lisp_world + uVar4);
      uVar1 = Lisp_world[(ulong)uVar4 + 2];
      lVar11 = 0;
      do {
        local_1038[lVar11] =
             *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar5 & 0xfffffff) * 2 ^ 3
                      );
        lVar11 = lVar11 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
    }
    local_1038[lVar6] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar3 == 0) {
    if (args[1] - 0xe0000 < 4) {
      iVar3 = *(int *)(&DAT_00143cc0 + (ulong)(args[1] - 0xe0000) * 4);
      alarm(TIMEOUT_TIME);
      piVar7 = __errno_location();
      do {
        *piVar7 = 0;
        uVar4 = open(local_1038,iVar3);
        if (uVar4 != 0xffffffff) {
          alarm(0);
          uVar5 = fcntl(uVar4,3,0);
          fcntl(uVar4,4,(ulong)(uVar5 | 0x800));
          if ((int)uVar4 < 0) {
            if (-0x10001 < (int)uVar4) {
              return uVar4 & 0xffff | 0xf0000;
            }
          }
          else if (uVar4 < 0x10000) {
            return uVar4 | 0xe0000;
          }
          error("Not Smallp data");
          return 0xe0000;
        }
      } while (*piVar7 == 4);
      alarm(0);
      err_mess("open",*piVar7);
      *Lisp_errno = *piVar7;
    }
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR CHAR_openfile(LispPTR *args)
/* args[0]            fullname */
/* args[1]            access */
/* args[2]            errno */
{
#ifndef DOS
  int fd;    /* return value  of open system call. */
  int flags; /* open system call's argument */
  /* struct stat statbuf; */
  char pathname[MAXPATHLEN];

  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringToCString(args[0], pathname, MAXPATHLEN);
  flags = O_NONBLOCK;
  ERRSETJMP(NIL);
  /*    TIMEOUT( rval=stat(pathname, &statbuf) );
      if(rval == 0){      } */
  switch (args[1]) {
    case ACCESS_INPUT: flags |= O_RDONLY; break;
    case ACCESS_OUTPUT: flags |= (O_WRONLY | O_CREAT); break;
    case ACCESS_APPEND: flags |= (O_APPEND | O_RDWR | O_CREAT); break;
    case ACCESS_BOTH: flags |= (O_RDWR | O_CREAT); break;
    default: return (NIL);
  }
  TIMEOUT(fd = open(pathname, flags));
  if (fd == -1) {
    err_mess("open", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  /* Prevent I/O requests from blocking -- make them error */
  /* if no char is available, or there's no room in pipe.  */
  fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) | O_NONBLOCK);

  return (GetSmallp(fd));
#endif /* DOS */
}